

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

void __thiscall
branch_and_reduce_algorithm::compute_alternative
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *A,
          vector<int,_std::allocator<int>_> *B)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  pointer pvVar4;
  int *piVar5;
  pointer piVar6;
  pointer piVar7;
  _func_int **pp_Var8;
  pointer psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  int iVar12;
  const_iterator __begin1;
  int *piVar13;
  void *pvVar14;
  const_iterator __end1;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint *puVar19;
  void *pvVar20;
  long lVar21;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var22;
  ulong uVar23;
  ulong uVar24;
  int *piVar25;
  const_iterator __begin1_1;
  ulong uVar26;
  vector<int,_std::allocator<int>_> *__range1_2;
  pointer piVar27;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> A2;
  vector<int,_std::allocator<int>_> B2;
  vector<int,_std::allocator<int>_> vs;
  vector<int,_std::allocator<int>_> removed;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newAdj;
  vector<int,_std::allocator<int>_> copyOfTmp;
  undefined1 local_129;
  void *local_128;
  void *local_120;
  long local_118;
  void *local_110;
  void *local_108;
  long local_100;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  pointer local_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b0;
  undefined1 local_98 [16];
  pointer local_88;
  
  piVar15 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar13 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar3 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((long)piVar2 - (long)piVar15 != (long)piVar3 - (long)piVar13) {
    __assert_fail("A.size() == B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0x126,
                  "void branch_and_reduce_algorithm::compute_alternative(const std::vector<int> &, const std::vector<int> &)"
                 );
  }
  iVar12 = (this->used).uid;
  iVar17 = iVar12 + 1;
  (this->used).uid = iVar17;
  if (iVar12 < -1) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar21 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar27;
    if (lVar21 != 0) {
      uVar23 = 0;
      do {
        piVar27[uVar23] = 0;
        uVar23 = uVar23 + 1;
      } while ((uVar23 & 0xffffffff) < (ulong)(lVar21 >> 2));
    }
    (this->used).uid = 1;
    iVar17 = 1;
  }
  if (piVar13 != piVar3) {
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar27 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar25 = pvVar4[*piVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = *(pointer *)
                ((long)&pvVar4[*piVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar25 != piVar5) {
        piVar6 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (piVar27[*piVar25] < 0) {
            piVar6[*piVar25] = iVar17;
          }
          piVar25 = piVar25 + 1;
        } while (piVar25 != piVar5);
      }
      piVar13 = piVar13 + 1;
    } while (piVar13 != piVar3);
  }
  if (piVar15 != piVar2) {
    do {
      pvVar4 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pvVar4[*piVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (piVar13 = pvVar4[*piVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar13 != piVar3; piVar13 = piVar13 + 1) {
        iVar17 = *piVar13;
        if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar17] < 0) &&
           ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar17] == (this->used).uid)) {
          set(this,iVar17,1);
        }
      }
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar2);
    iVar17 = (this->used).uid;
  }
  iVar12 = iVar17 + 1;
  (this->used).uid = iVar12;
  if (iVar17 < -1) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar21 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar27;
    if (lVar21 != 0) {
      uVar23 = 0;
      do {
        piVar27[uVar23] = 0;
        uVar23 = uVar23 + 1;
      } while ((uVar23 & 0xffffffff) < (ulong)(lVar21 >> 2));
    }
    (this->used).uid = 1;
    iVar12 = 1;
  }
  piVar15 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar15 != piVar2) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar27[*piVar15] = iVar12;
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar2);
  }
  piVar15 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar23 = 0;
  if (piVar15 != piVar2) {
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar27 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar13 = pvVar4[*piVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pvVar4[*piVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar13 != piVar3) {
        piVar6 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar17 = *piVar13;
          if ((piVar27[iVar17] < 0) &&
             (iVar12 = (this->used).uid, iVar1 = piVar7[iVar17], piVar7[iVar17] = iVar12,
             iVar1 != iVar12)) {
            iVar12 = (int)uVar23;
            uVar23 = (ulong)(iVar12 + 1);
            piVar6[iVar12] = iVar17;
          }
          piVar13 = piVar13 + 1;
        } while (piVar13 != piVar3);
      }
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar2);
    uVar23 = (ulong)(int)uVar23;
  }
  _Var22._M_current =
       (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&local_128,_Var22,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (_Var22._M_current + uVar23),(allocator_type *)local_98);
  pvVar20 = local_120;
  pvVar14 = local_128;
  if (local_128 != local_120) {
    uVar23 = (long)local_120 - (long)local_128 >> 2;
    lVar21 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_128,local_120,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar14,pvVar20);
  }
  iVar12 = (this->used).uid;
  iVar17 = iVar12 + 1;
  (this->used).uid = iVar17;
  if (iVar12 < -1) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar21 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar27;
    if (lVar21 != 0) {
      uVar23 = 0;
      do {
        piVar27[uVar23] = 0;
        uVar23 = uVar23 + 1;
      } while ((uVar23 & 0xffffffff) < (ulong)(lVar21 >> 2));
    }
    (this->used).uid = 1;
    iVar17 = 1;
  }
  piVar15 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar15 != piVar2) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar27[*piVar15] = iVar17;
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar2);
  }
  piVar15 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar23 = 0;
  if (piVar15 != piVar2) {
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar27 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar13 = pvVar4[*piVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pvVar4[*piVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar13 != piVar3) {
        piVar6 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar17 = *piVar13;
          if ((piVar27[iVar17] < 0) &&
             (iVar12 = (this->used).uid, iVar1 = piVar7[iVar17], piVar7[iVar17] = iVar12,
             iVar1 != iVar12)) {
            iVar12 = (int)uVar23;
            uVar23 = (ulong)(iVar12 + 1);
            piVar6[iVar12] = iVar17;
          }
          piVar13 = piVar13 + 1;
        } while (piVar13 != piVar3);
      }
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar2);
    uVar23 = (ulong)(int)uVar23;
  }
  _Var22._M_current =
       (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&local_110,_Var22,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (_Var22._M_current + uVar23),(allocator_type *)local_98);
  pvVar20 = local_108;
  pvVar14 = local_110;
  if (local_110 != local_108) {
    uVar23 = (long)local_108 - (long)local_110 >> 2;
    lVar21 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_110,local_108,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar14,pvVar20);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,
             ((long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) +
             ((long)(A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2),(allocator_type *)local_98);
  piVar27 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar6 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar21 = (long)piVar6 - (long)piVar27;
  if (lVar21 != 0) {
    uVar23 = 0;
    do {
      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar23] = piVar27[uVar23];
      uVar23 = uVar23 + 1;
    } while ((uVar23 & 0xffffffff) < (ulong)((long)piVar6 - (long)piVar27 >> 2));
  }
  piVar27 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  lVar18 = (long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar27;
  if (lVar18 != 0) {
    uVar23 = 0;
    do {
      *(int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar23 * 4 + lVar21) = piVar27[uVar23];
      uVar23 = uVar23 + 1;
    } while ((uVar23 & 0xffffffff) < (ulong)(lVar18 >> 2));
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f8,
             ((long)local_108 - (long)local_110 >> 2) + ((long)local_120 - (long)local_128 >> 2),
             (allocator_type *)local_98);
  if ((long)local_120 - (long)local_128 != 0) {
    uVar23 = 0;
    do {
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar23] = *(int *)((long)local_128 + uVar23 * 4);
      uVar23 = uVar23 + 1;
    } while ((uVar23 & 0xffffffff) < (ulong)((long)local_120 - (long)local_128 >> 2));
  }
  if ((long)local_108 - (long)local_110 != 0) {
    uVar23 = 0;
    do {
      *(undefined4 *)
       ((long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + uVar23 * 4 + ((long)local_120 - (long)local_128)) =
           *(undefined4 *)((long)local_110 + uVar23 * 4);
      uVar23 = uVar23 + 1;
    } while ((uVar23 & 0xffffffff) < (ulong)((long)local_108 - (long)local_110 >> 2));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_b0,
           (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2,(allocator_type *)local_98);
  iVar12 = (this->used).uid;
  iVar17 = iVar12 + 1;
  (this->used).uid = iVar17;
  if (iVar12 < -1) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar21 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar27;
    if (lVar21 != 0) {
      uVar23 = 0;
      do {
        piVar27[uVar23] = 0;
        uVar23 = uVar23 + 1;
      } while ((uVar23 & 0xffffffff) < (ulong)(lVar21 >> 2));
    }
    (this->used).uid = 1;
    iVar17 = 1;
  }
  piVar15 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar15 != piVar2) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar27[*piVar15] = iVar17;
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar2);
  }
  piVar15 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar15 != piVar2) {
    piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar27[*piVar15] = iVar17;
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar2);
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar23 = 0;
    do {
      uVar16 = (long)local_120 - (long)local_128 >> 2;
      puVar19 = (uint *)((long)local_110 + (uVar23 - uVar16) * 4);
      if (uVar23 < uVar16) {
        puVar19 = (uint *)((long)local_128 + uVar23 * 4);
      }
      pvVar14 = local_128;
      if (uVar23 < uVar16) {
        pvVar14 = local_110;
      }
      pvVar4 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var22._M_current =
           (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      piVar15 = pvVar4[*puVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 = *(pointer *)
                ((long)&pvVar4[*puVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar15 == piVar2) {
        uVar24 = 0;
        iVar17 = 0;
      }
      else {
        local_b8 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar17 = 0;
        uVar24 = 0;
        do {
          iVar12 = *piVar15;
          if ((local_b8[iVar12] < 0) && (piVar27[iVar12] != (this->used).uid)) {
            pvVar20 = local_120;
            if (uVar23 < uVar16) {
              pvVar20 = local_108;
            }
            uVar26 = (ulong)(int)uVar24;
            if (uVar26 < (ulong)((long)pvVar20 - (long)pvVar14 >> 2)) {
              piVar6 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                iVar1 = *(int *)((long)pvVar14 + uVar26 * 4);
                if (iVar12 < iVar1) break;
                if (piVar27[iVar1] != (this->used).uid) {
                  lVar21 = (long)iVar17;
                  iVar17 = iVar17 + 1;
                  piVar6[lVar21] = iVar1;
                }
                uVar26 = uVar26 + 1;
                pvVar20 = local_120;
                if (uVar23 < uVar16) {
                  pvVar20 = local_108;
                }
              } while (uVar26 < (ulong)((long)pvVar20 - (long)pvVar14 >> 2));
              uVar24 = uVar26 & 0xffffffff;
            }
            if (iVar17 == 0) {
              lVar21 = 0;
            }
            else {
              lVar21 = (long)iVar17;
              if (_Var22._M_current[lVar21 + -1] == iVar12) goto LAB_0010a421;
            }
            iVar17 = iVar17 + 1;
            _Var22._M_current[lVar21] = iVar12;
          }
LAB_0010a421:
          piVar15 = piVar15 + 1;
        } while (piVar15 != piVar2);
        _Var22._M_current =
             (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        uVar24 = (ulong)(int)uVar24;
      }
      pvVar20 = local_120;
      if (uVar23 < uVar16) {
        pvVar20 = local_108;
      }
      if (uVar24 < (ulong)((long)pvVar20 - (long)pvVar14 >> 2)) {
        piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar12 = *(int *)((long)pvVar14 + uVar24 * 4);
          if (piVar27[iVar12] != (this->used).uid) {
            lVar21 = (long)iVar17;
            iVar17 = iVar17 + 1;
            _Var22._M_current[lVar21] = iVar12;
          }
          uVar24 = uVar24 + 1;
          pvVar20 = local_120;
          if (uVar23 < uVar16) {
            pvVar20 = local_108;
          }
        } while (uVar24 < (ulong)((long)pvVar20 - (long)pvVar14 >> 2));
      }
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_98,_Var22,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (_Var22._M_current + iVar17),(allocator_type *)&local_c8);
      pp_Var8 = (_func_int **)
                local_b0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar23].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar27 = local_b0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar23].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      piVar6 = local_b0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar23].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar23].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_98._0_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar23].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_98._8_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar23].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_88;
      local_98._0_8_ = pp_Var8;
      local_98._8_8_ = piVar27;
      local_88 = piVar6;
      if (pp_Var8 != (_func_int **)0x0) {
        operator_delete(pp_Var8,(long)piVar6 - (long)pp_Var8);
      }
      uVar23 = (ulong)((int)uVar23 + 1);
    } while (uVar23 < (ulong)((long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  alternative::alternative
            ((alternative *)local_98,
             (int)((ulong)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3),&local_e0,&local_f8,
             &local_b0,this,(int)((ulong)((long)local_120 - (long)local_128) >> 2));
  local_c8 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<alternative,std::allocator<alternative>,alternative>
            (&_Stack_c0,(alternative **)&local_c8,(allocator<alternative> *)&local_129,
             (alternative *)local_98);
  _Var11._M_pi = _Stack_c0._M_pi;
  peVar10 = local_c8;
  iVar17 = this->modifiedN;
  this->modifiedN = iVar17 + 1;
  psVar9 = (this->modifieds).
           super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (element_type *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = psVar9[iVar17].super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  psVar9 = psVar9 + iVar17;
  (psVar9->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar10;
  (psVar9->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var11._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  modified::~modified((modified *)local_98);
  if (USE_DEPENDENCY_CHECKING == true) {
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar27 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar2 = *(pointer *)
                  ((long)&pvVar4[*piVar27].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (piVar15 = pvVar4[*piVar27].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar15 != piVar2; piVar15 = piVar15 + 1) {
          ArraySet::Insert(&this->dc_candidates,*piVar15);
        }
        piVar27 = piVar27 + 1;
      } while (piVar27 !=
               local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar27 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar17 = *piVar27;
        ArraySet::Insert(&this->dc_candidates,iVar17);
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar2 = *(pointer *)
                  ((long)&pvVar4[iVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (piVar15 = pvVar4[iVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar15 != piVar2; piVar15 = piVar15 + 1) {
          ArraySet::Insert(&this->dc_candidates,*piVar15);
        }
        piVar27 = piVar27 + 1;
      } while (piVar27 !=
               local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b0);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110 != (void *)0x0) {
    operator_delete(local_110,local_100 - (long)local_110);
  }
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::compute_alternative(std::vector<int> const &A, std::vector<int> const &B)
{
    assert(A.size() == B.size());
    used.clear();
    for (int b : B)
        for (int u : adj[b])
            if (x[u] < 0)
                used.add(u);

    for (int a : A)
        for (int u : adj[a])
            if (x[u] < 0 && used.get(u))
                set(u, 1);
    // sets v in N(A) and N(B) to 1

    NodeID p = 0, q = 0;
    std::vector<int> &tmp = modTmp;
    used.clear();
    for (int b : B)
        used.add(b);

    for (int a : A)
        for (int u : adj[a])
            if (x[u] < 0 && used.add(u))
                tmp[p++] = u;

    std::vector<int> A2(tmp.begin(), tmp.begin() + p);
    std::sort(A2.begin(), A2.end());
    // A2 contains v in N(A)\(B and N(B))
    p = 0;
    used.clear();
    for (int a : A)
        used.add(a);
    for (int b : B)
        for (int u : adj[b])
            if (x[u] < 0 && used.add(u))
                tmp[p++] = u;

    std::vector<int> B2(tmp.begin(), tmp.begin() + p);
    std::sort(B2.begin(), B2.end());
    // B2 contains v in N(B)\(A and N(A))

    std::vector<int> removed(A.size() + B.size());
    for (unsigned int i = 0; i < A.size(); i++)
        removed[i] = A[i];
    for (unsigned int i = 0; i < B.size(); i++)
        removed[A.size() + i] = B[i];
    std::vector<int> vs(A2.size() + B2.size());
    for (unsigned int i = 0; i < A2.size(); i++)
        vs[i] = A2[i];
    for (unsigned int i = 0; i < B2.size(); i++)
        vs[A2.size() + i] = B2[i];
    std::vector<std::vector<int>> newAdj(vs.size());
    used.clear();
    for (int a : A)
        used.add(a);
    for (int b : B)
        used.add(b);
    for (unsigned int i = 0; i < vs.size(); i++)
    {
        unsigned int v = (i < A2.size()) ? A2[i] : B2[i - A2.size()];
        std::vector<int> const &C = (i < A2.size()) ? B2 : A2;
        p = q = 0;
        for (int u : adj[v])
            if (x[u] < 0 && !used.get(u))
            {
                while (q < C.size() && C[q] <= u)
                {
                    if (used.get(C[q]))
                        q++;
                    else
                        tmp[p++] = C[q++];
                }
                if (p == 0 || tmp[p - 1] != u)
                    tmp[p++] = u;
            }
        while (q < C.size())
        {
            if (used.get(C[q]))
                q++;
            else
                tmp[p++] = C[q++];
        }
        {
            std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
            newAdj[i].swap(copyOfTmp);
        }
    }

    modifieds[modifiedN++] = make_shared<alternative>(alternative(removed.size() / 2, removed, vs, newAdj, this, A2.size()));

    if (USE_DEPENDENCY_CHECKING) {
        for (int v : removed) {
            for (int n : adj[v]) {
                dc_candidates.Insert(n);
            }
        }

        for (int v : vs) {
            dc_candidates.Insert(v);
            for (int n : adj[v]) {
                dc_candidates.Insert(n);
            }
        }
    }
}